

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

DeepScanLineInputFile * __thiscall
Imf_2_5::MultiPartInputFile::getInputPart<Imf_2_5::DeepScanLineInputFile>
          (MultiPartInputFile *this,int partNumber)

{
  bool bVar1;
  DeepScanLineInputFile *pDVar2;
  InputPartData *this_00;
  map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
  *in_RDI;
  DeepScanLineInputFile *file;
  Lock lock;
  map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
  *in_stack_ffffffffffffff28;
  Lock *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Data *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  key_type_conflict *in_stack_ffffffffffffff68;
  _Self local_48 [3];
  _Self local_30 [5];
  DeepScanLineInputFile *local_8;
  
  IlmThread_2_5::Lock::Lock
            ((Lock *)in_stack_ffffffffffffff40,
             (Mutex *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type_conflict *)0x7f4043);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator==(local_30,local_48);
  if (bVar1) {
    pDVar2 = (DeepScanLineInputFile *)operator_new(0x10);
    this_00 = Data::getPart(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)this_00,
               (InputPartData *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::make_pair<int&,Imf_2_5::GenericInputFile*>
              ((int *)in_stack_ffffffffffffff30,(GenericInputFile **)in_stack_ffffffffffffff28);
    std::
    map<int,Imf_2_5::GenericInputFile*,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericInputFile*>>>
    ::insert<std::pair<int,Imf_2_5::GenericInputFile*>>
              ((map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
                *)in_stack_ffffffffffffff40,
               (pair<int,_Imf_2_5::GenericInputFile_*> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_8 = pDVar2;
  }
  else {
    in_stack_ffffffffffffff30 =
         (Lock *)std::
                 map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
                 ::operator[](in_RDI,in_stack_ffffffffffffff68);
    local_8 = (DeepScanLineInputFile *)in_stack_ffffffffffffff30->_mutex;
  }
  IlmThread_2_5::Lock::~Lock(in_stack_ffffffffffffff30);
  return local_8;
}

Assistant:

T*
MultiPartInputFile::getInputPart(int partNumber)
{
    Lock lock(*_data);
            if (_data->_inputFiles.find(partNumber) == _data->_inputFiles.end())
        {
            T* file = new T(_data->getPart(partNumber));
            _data->_inputFiles.insert(std::make_pair(partNumber, (GenericInputFile*) file));
            return file;
        }
        else return (T*) _data->_inputFiles[partNumber];
}